

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>_>
::insert(Table<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  SegmentReader *pSVar2;
  Entry *pEVar3;
  size_t sVar4;
  ArrayPtr<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> table;
  HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks> local_28 [16];
  
  pEVar3 = (this->rows).builder.ptr;
  sVar4 = ((long)(this->rows).builder.pos - (long)pEVar3 >> 3) * -0x5555555555555555;
  table.size_ = (size_t)pEVar3;
  table.ptr = (Entry *)&this->indexes;
  HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>::
  insert<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,unsigned_int&>
            (local_28,table,sVar4,(uint *)sVar4);
  if (local_28[0] !=
      (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)0x1) {
    pEVar3 = (this->rows).builder.pos;
    if (pEVar3 == (this->rows).builder.endPtr) {
      pEVar1 = (this->rows).builder.ptr;
      sVar4 = 4;
      if (pEVar3 != pEVar1) {
        sVar4 = ((long)pEVar3 - (long)pEVar1 >> 3) * 0x5555555555555556;
      }
      Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::setCapacity
                (&this->rows,sVar4);
      pEVar3 = (this->rows).builder.pos;
    }
    pEVar3->key = row->key;
    pSVar2 = (row->value).ptr;
    (pEVar3->value).disposer = (row->value).disposer;
    (pEVar3->value).ptr = pSVar2;
    (row->value).ptr = (SegmentReader *)0x0;
    (this->rows).builder.pos = pEVar3 + 1;
    return pEVar3;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }